

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O0

shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
mini_bus::MiniBusClient::send_simple_abi_cxx11_
          (MiniBusClient *this,string_view command,string_view payload)

{
  string_view str;
  string_view str_00;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pbVar1;
  char *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  MiniBusClient *this_00;
  char *in_R9;
  basic_string_view<char,_std::char_traits<char>_> data;
  shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sVar2;
  undefined1 local_f0 [8];
  shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tok;
  const_buffer local_c8;
  undefined1 auStack_b8 [8];
  string_view view;
  undefined1 local_80 [8];
  MiniBusEncoder encoder;
  uint32_t local_4c;
  undefined1 local_48 [4];
  uint32_t rid;
  unique_lock<std::mutex> lock;
  MiniBusClient *this_local;
  string_view payload_local;
  string_view command_local;
  
  this_00 = (MiniBusClient *)command._M_len;
  lock._8_8_ = this_00;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_48,&this_00->mtx);
  local_4c = select_rid(this_00);
  MiniBusEncoder::MiniBusEncoder((MiniBusEncoder *)local_80);
  MiniBusEncoder::insert_rid((MiniBusEncoder *)local_80,local_4c);
  str_00._M_str = (char *)payload._M_len;
  str_00._M_len = (size_t)command._M_str;
  MiniBusEncoder::insert_short_string((MiniBusEncoder *)local_80,str_00);
  str._M_str = in_R9;
  str._M_len = (size_t)payload._M_str;
  view._M_str = payload._M_str;
  MiniBusEncoder::insert_long_string((MiniBusEncoder *)local_80,str);
  _auStack_b8 = MiniBusEncoder::view((MiniBusEncoder *)local_80);
  pbVar1 = std::
           optional<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           ::operator*(&this_00->socket);
  data._M_str = extraout_RDX;
  data._M_len = view._M_len;
  local_c8 = (const_buffer)boost::asio::buffer<char,std::char_traits<char>>((asio *)auStack_b8,data)
  ;
  boost::asio::transfer_all();
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::detail::transfer_all_t>
            (pbVar1,&local_c8,0);
  std::make_shared<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>();
  std::
  map<unsigned_long,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
  ::
  emplace<unsigned_int&,std::shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>&>
            ((map<unsigned_long,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>>>>>
              *)&this_00->reqmap,&local_4c,
             (shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f0);
  std::shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::string>>>::
  shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::string>>,void>
            ((shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::string>>> *)this,
             (shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f0);
  std::
  shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<mini_bus::NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_f0);
  MiniBusEncoder::~MiniBusEncoder((MiniBusEncoder *)local_80);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX_00._M_pi;
  sVar2.
  super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )sVar2.
           super___shared_ptr<mini_bus::IBaseNotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

inline std::shared_ptr<IBaseNotifyToken<std::optional<std::string>>>
  send_simple(std::string_view command, std::string_view payload = {}) {
    std::unique_lock lock{mtx};
    auto rid = select_rid();
    MiniBusEncoder encoder;
    encoder.insert_rid(rid);
    encoder.insert_short_string(command);
    encoder.insert_long_string(payload);
    auto view = encoder.view();
    write(*socket, buffer(view), transfer_all());
    auto tok = std::make_shared<NotifyToken<std::optional<std::string>>>();
    reqmap.emplace(rid, tok);
    return tok;
  }